

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_service_client(t_javame_generator *this,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  uint uVar2;
  t_service *ptVar3;
  ostream *poVar4;
  ulong uVar5;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar6;
  string *psVar7;
  t_struct *ptVar8;
  t_type *ptVar9;
  reference pptVar10;
  char *pcVar11;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_950
  ;
  t_field **local_948;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_940
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_908;
  allocator local_8e1;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  string local_6d8;
  allocator local_6b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  undefined1 local_670 [8];
  t_function recv_function;
  t_struct noargs;
  string resultname;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_428
  ;
  t_field **local_420;
  string local_418;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  string local_3b0;
  undefined1 local_390 [8];
  string argsname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_328 [8];
  t_function send_function;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_268
  ;
  t_field **local_260;
  byte local_251;
  const_iterator cStack_250;
  bool first;
  const_iterator fld_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  string local_230;
  string local_210;
  string local_1f0 [8];
  string funname;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1c8;
  t_function **local_1c0;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1b8;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  allocator local_71;
  string local_70 [8];
  string extends_client;
  allocator local_39;
  undefined1 local_38 [8];
  string extends;
  t_service *tservice_local;
  t_javame_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    type_name_abi_cxx11_(&local_98,this,&ptVar3->super_t_type,false,false,false);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_d8," extends ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::operator+(&local_b8,&local_d8,".Client");
    std::__cxx11::string::operator=(local_70,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public static class Client");
  poVar4 = std::operator<<(poVar4,local_70);
  poVar4 = std::operator<<(poVar4," implements TServiceClient, Iface {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public Client(TProtocol prot)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"this(prot, prot);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public Client(TProtocol iprot, TProtocol oprot)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_138);
    poVar4 = std::operator<<(poVar4,"super(iprot, oprot);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_138);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_f8);
    poVar4 = std::operator<<(poVar4,"iprot_ = iprot;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_118);
    poVar4 = std::operator<<(poVar4,"oprot_ = oprot;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"protected TProtocol iprot_;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_178);
    poVar4 = std::operator<<(poVar4,"protected TProtocol oprot_;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &functions.
                                     super__Vector_base<t_function_*,_std::allocator<t_function_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar4 = std::operator<<(poVar4,"protected int seqid_;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"public TProtocol getInputProtocol()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"return this.iprot_;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"public TProtocol getOutputProtocol()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"return this.oprot_;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  }
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_1b8);
  local_1c8._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_1c0,&local_1c8);
  local_1b8._M_current = local_1c0;
  while( true ) {
    funname.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1b8,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&funname.field_2 + 8));
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string(local_1f0,(string *)psVar7);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"public ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    tfunction = *pptVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"",(allocator *)((long)&arg_struct + 7));
    function_signature(&local_210,this,tfunction,&local_230);
    poVar4 = std::operator<<(poVar4,(string *)&local_210);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)((long)&arg_struct + 7));
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"send_");
    poVar4 = std::operator<<(poVar4,local_1f0);
    std::operator<<(poVar4,"(");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    ptVar8 = t_function::get_arglist(*pptVar6);
    fld_iter._M_current = (t_field **)t_struct::get_members(ptVar8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffdb0);
    local_251 = 1;
    local_260 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(fld_iter._M_current);
    cStack_250 = (const_iterator)local_260;
    while( true ) {
      local_268._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(fld_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffdb0,&local_268);
      if (!bVar1) break;
      if ((local_251 & 1) == 0) {
        std::operator<<((ostream *)&this->f_service_,", ");
      }
      else {
        local_251 = 0;
      }
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&stack0xfffffffffffffdb0);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
      std::operator<<((ostream *)&this->f_service_,(string *)psVar7);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&stack0xfffffffffffffdb0);
    }
    poVar4 = std::operator<<((ostream *)&this->f_service_,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    bVar1 = t_function::is_oneway(*pptVar6);
    if (!bVar1) {
      t_generator::indent_abi_cxx11_((string *)&send_function.own_xceptions_,(t_generator *)this);
      std::operator<<((ostream *)&this->f_service_,(string *)&send_function.own_xceptions_);
      std::__cxx11::string::~string((string *)&send_function.own_xceptions_);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      ptVar9 = t_function::get_returntype(*pptVar6);
      uVar2 = (*(ptVar9->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        std::operator<<((ostream *)&this->f_service_,"return ");
      }
      poVar4 = std::operator<<((ostream *)&this->f_service_,"recv_");
      poVar4 = std::operator<<(poVar4,local_1f0);
      poVar4 = std::operator<<(poVar4,"();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    ptVar9 = g_type_void;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_368,"send_",(allocator *)(argsname.field_2._M_local_buf + 0xf));
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::operator+(&local_348,&local_368,psVar7);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    ptVar8 = t_function::get_arglist(*pptVar6);
    t_function::t_function((t_function *)local_328,ptVar9,&local_348,ptVar8,false);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)(argsname.field_2._M_local_buf + 0xf));
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                   psVar7,"_args");
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"public ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d0,"",&local_3d1);
    function_signature(&local_3b0,this,(t_function *)local_328,&local_3d0);
    poVar4 = std::operator<<(poVar4,(string *)&local_3b0);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    t_generator::indent_abi_cxx11_(&local_3f8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3f8);
    poVar4 = std::operator<<(poVar4,"oprot_.writeMessageBegin(new TMessage(\"");
    poVar4 = std::operator<<(poVar4,local_1f0);
    poVar4 = std::operator<<(poVar4,"\", ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    bVar1 = t_function::is_oneway(*pptVar6);
    pcVar11 = "TMessageType.CALL";
    if (bVar1) {
      pcVar11 = "TMessageType.ONEWAY";
    }
    poVar4 = std::operator<<(poVar4,pcVar11);
    poVar4 = std::operator<<(poVar4,", ++seqid_));");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_418,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_418);
    poVar4 = std::operator<<(poVar4,(string *)local_390);
    poVar4 = std::operator<<(poVar4," args = new ");
    poVar4 = std::operator<<(poVar4,(string *)local_390);
    poVar4 = std::operator<<(poVar4,"();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f8);
    local_420 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(fld_iter._M_current);
    cStack_250 = (const_iterator)local_420;
    while( true ) {
      local_428._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(fld_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffdb0,&local_428);
      if (!bVar1) break;
      t_generator::indent_abi_cxx11_(&local_448,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_448);
      poVar4 = std::operator<<(poVar4,"args.set");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&stack0xfffffffffffffdb0);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
      std::__cxx11::string::string((string *)&local_488,(string *)psVar7);
      get_cap_name(&local_468,this,&local_488);
      poVar4 = std::operator<<(poVar4,(string *)&local_468);
      poVar4 = std::operator<<(poVar4,"(");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&stack0xfffffffffffffdb0);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar4 = std::operator<<(poVar4,(string *)psVar7);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_448);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&stack0xfffffffffffffdb0);
    }
    t_generator::indent_abi_cxx11_(&local_4a8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_4a8);
    poVar4 = std::operator<<(poVar4,"args.write(oprot_);");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_4c8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_4c8);
    poVar4 = std::operator<<(poVar4,"oprot_.writeMessageEnd();");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)((long)&resultname.field_2 + 8),(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"oprot_.getTransport().flush();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(resultname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4a8);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1b8);
    bVar1 = t_function::is_oneway(*pptVar6);
    if (!bVar1) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &noargs.xsd_all_,psVar7,"_result");
      t_struct::t_struct((t_struct *)&recv_function.own_xceptions_,
                         (this->super_t_oop_generator).super_t_generator.program_);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      ptVar9 = t_function::get_returntype(*pptVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6b0,"recv_",&local_6b1);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
      std::operator+(&local_690,&local_6b0,psVar7);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      ptVar8 = t_function::get_xceptions(*pptVar6);
      t_function::t_function
                ((t_function *)local_670,ptVar9,&local_690,(t_struct *)&recv_function.own_xceptions_
                 ,ptVar8,false);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"public ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6f8,"",&local_6f9);
      function_signature(&local_6d8,this,(t_function *)local_670,&local_6f8);
      poVar4 = std::operator<<(poVar4,(string *)&local_6d8);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
      t_generator::indent_abi_cxx11_(&local_720,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_720);
      poVar4 = std::operator<<(poVar4,"TMessage msg = iprot_.readMessageBegin();");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_740,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_740);
      poVar4 = std::operator<<(poVar4,"if (msg.type == TMessageType.EXCEPTION) {");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_760,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_760);
      poVar4 = std::operator<<(poVar4,
                               "  TApplicationException x = TApplicationException.read(iprot_);");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_780,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_780);
      poVar4 = std::operator<<(poVar4,"  iprot_.readMessageEnd();");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_7a0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_7a0);
      poVar4 = std::operator<<(poVar4,"  throw x;");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_7c0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_7c0);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_7e0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_7e0);
      poVar4 = std::operator<<(poVar4,"if (msg.seqid != seqid_) {");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_800,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_800);
      poVar4 = std::operator<<(poVar4,
                               "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \""
                              );
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
      poVar4 = std::operator<<(poVar4,(string *)psVar7);
      poVar4 = std::operator<<(poVar4," failed: out of sequence response\");");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_820,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_820);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_840,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_840);
      poVar4 = std::operator<<(poVar4,(string *)&noargs.xsd_all_);
      poVar4 = std::operator<<(poVar4," result = new ");
      poVar4 = std::operator<<(poVar4,(string *)&noargs.xsd_all_);
      poVar4 = std::operator<<(poVar4,"();");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_860,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_860);
      poVar4 = std::operator<<(poVar4,"result.read(iprot_);");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_880,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_880);
      poVar4 = std::operator<<(poVar4,"iprot_.readMessageEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_820);
      std::__cxx11::string::~string((string *)&local_800);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_740);
      std::__cxx11::string::~string((string *)&local_720);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      ptVar9 = t_function::get_returntype(*pptVar6);
      uVar2 = (*(ptVar9->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_8a0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_8a0);
        poVar4 = std::operator<<(poVar4,"if (result.");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8e0,"success",&local_8e1);
        generate_isset_check(&local_8c0,this,&local_8e0);
        poVar4 = std::operator<<(poVar4,(string *)&local_8c0);
        poVar4 = std::operator<<(poVar4,") {");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_908,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_908);
        poVar4 = std::operator<<(poVar4,"  return result.success;");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)&xs,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&xs);
        poVar4 = std::operator<<(poVar4,"}");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&xs);
        std::__cxx11::string::~string((string *)&local_908);
        std::__cxx11::string::~string((string *)&local_8c0);
        std::__cxx11::string::~string((string *)&local_8e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
        std::__cxx11::string::~string((string *)&local_8a0);
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      ptVar8 = t_function::get_xceptions(*pptVar6);
      x_iter._M_current = (t_field **)t_struct::get_members(ptVar8);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_940);
      local_948 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      local_940._M_current = local_948;
      while( true ) {
        local_950._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_940,&local_950);
        if (!bVar1) break;
        t_generator::indent_abi_cxx11_(&local_970,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_970);
        poVar4 = std::operator<<(poVar4,"if (result.");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_940);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," != null) {");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_990,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_990);
        poVar4 = std::operator<<(poVar4,"  throw result.");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_940);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar10);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4,";");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_9b0,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_9b0);
        poVar4 = std::operator<<(poVar4,"}");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_9b0);
        std::__cxx11::string::~string((string *)&local_990);
        std::__cxx11::string::~string((string *)&local_970);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_940);
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1b8);
      ptVar9 = t_function::get_returntype(*pptVar6);
      uVar2 = (*(ptVar9->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_9d0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_9d0);
        poVar4 = std::operator<<(poVar4,
                                 "throw new TApplicationException(TApplicationException.MISSING_RESULT, \""
                                );
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_1b8);
        psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," failed: unknown result\");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_9d0);
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"return;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
      std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
      t_function::~t_function((t_function *)local_670);
      t_struct::~t_struct((t_struct *)&recv_function.own_xceptions_);
      std::__cxx11::string::~string((string *)&noargs.xsd_all_);
    }
    std::__cxx11::string::~string((string *)local_390);
    t_function::~t_function((t_function *)local_328);
    std::__cxx11::string::~string(local_1f0);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_1b8);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_javame_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_client = " extends " + extends + ".Client";
  }

  indent(f_service_) << "public static class Client" << extends_client
                     << " implements TServiceClient, Iface {" << endl;
  indent_up();

  indent(f_service_) << "public Client(TProtocol prot)" << endl;
  scope_up(f_service_);
  indent(f_service_) << "this(prot, prot);" << endl;
  scope_down(f_service_);
  f_service_ << endl;

  indent(f_service_) << "public Client(TProtocol iprot, TProtocol oprot)" << endl;
  scope_up(f_service_);
  if (extends.empty()) {
    f_service_ << indent() << "iprot_ = iprot;" << endl << indent() << "oprot_ = oprot;" << endl;
  } else {
    f_service_ << indent() << "super(iprot, oprot);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  if (extends.empty()) {
    f_service_ << indent() << "protected TProtocol iprot_;" << endl << indent()
               << "protected TProtocol oprot_;" << endl << endl << indent()
               << "protected int seqid_;" << endl << endl;

    indent(f_service_) << "public TProtocol getInputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.iprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;

    indent(f_service_) << "public TProtocol getOutputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.oprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();

    // Open function
    indent(f_service_) << "public " << function_signature(*f_iter) << endl;
    scope_up(f_service_);
    indent(f_service_) << "send_" << funname << "(";

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    // Declare the function arguments
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    bool first = true;
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << (*fld_iter)->get_name();
    }
    f_service_ << ");" << endl;

    if (!(*f_iter)->is_oneway()) {
      f_service_ << indent();
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << "return ";
      }
      f_service_ << "recv_" << funname << "();" << endl;
    }
    scope_down(f_service_);
    f_service_ << endl;

    t_function send_function(g_type_void,
                             string("send_") + (*f_iter)->get_name(),
                             (*f_iter)->get_arglist());

    string argsname = (*f_iter)->get_name() + "_args";

    // Open function
    indent(f_service_) << "public " << function_signature(&send_function) << endl;
    scope_up(f_service_);

    // Serialize the request
    f_service_ << indent() << "oprot_.writeMessageBegin(new TMessage(\"" << funname << "\", "
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
               << ", ++seqid_));" << endl << indent() << argsname << " args = new " << argsname
               << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args.set" << get_cap_name((*fld_iter)->get_name()) << "("
                 << (*fld_iter)->get_name() << ");" << endl;
    }

    f_service_ << indent() << "args.write(oprot_);" << endl << indent()
               << "oprot_.writeMessageEnd();" << endl << indent()
               << "oprot_.getTransport().flush();" << endl;

    scope_down(f_service_);
    f_service_ << endl;

    if (!(*f_iter)->is_oneway()) {
      string resultname = (*f_iter)->get_name() + "_result";

      t_struct noargs(program_);
      t_function recv_function((*f_iter)->get_returntype(),
                               string("recv_") + (*f_iter)->get_name(),
                               &noargs,
                               (*f_iter)->get_xceptions());
      // Open function
      indent(f_service_) << "public " << function_signature(&recv_function) << endl;
      scope_up(f_service_);

      f_service_ << indent() << "TMessage msg = iprot_.readMessageBegin();" << endl << indent()
                 << "if (msg.type == TMessageType.EXCEPTION) {" << endl << indent()
                 << "  TApplicationException x = TApplicationException.read(iprot_);" << endl
                 << indent() << "  iprot_.readMessageEnd();" << endl << indent() << "  throw x;"
                 << endl << indent() << "}" << endl << indent() << "if (msg.seqid != seqid_) {"
                 << endl << indent()
                 << "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \""
                 << (*f_iter)->get_name() << " failed: out of sequence response\");" << endl
                 << indent() << "}" << endl << indent() << resultname << " result = new "
                 << resultname << "();" << endl << indent() << "result.read(iprot_);" << endl
                 << indent() << "iprot_.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "if (result." << generate_isset_check("success") << ") {" << endl
                   << indent() << "  return result.success;" << endl << indent() << "}" << endl;
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        f_service_ << indent() << "if (result." << (*x_iter)->get_name() << " != null) {" << endl
                   << indent() << "  throw result." << (*x_iter)->get_name() << ";" << endl
                   << indent() << "}" << endl;
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "return;" << endl;
      } else {
        f_service_ << indent()
                   << "throw new TApplicationException(TApplicationException.MISSING_RESULT, \""
                   << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
      }

      // Close function
      scope_down(f_service_);
      f_service_ << endl;
    }
  }

  indent_down();
  indent(f_service_) << "}" << endl;
}